

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 extraout_RAX;
  allocator local_437;
  allocator local_436;
  allocator local_435;
  undefined4 local_434;
  string local_430;
  string local_410;
  string local_3f0;
  vector<Token,_std::allocator<Token>_> local_3d0;
  Parser par;
  bool local_315;
  SwitchArg argAst;
  Lexer lex;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  tables;
  bool local_e5;
  SwitchArg argTest;
  
  std::__cxx11::string::string((string *)&par,"Toy compiler",(allocator *)&argTest);
  std::__cxx11::string::string((string *)&tables,"0.1",(allocator *)&argAst);
  TCLAP::CmdLine::CmdLine((CmdLine *)&lex,(string *)&par,' ',(string *)&tables,true);
  std::__cxx11::string::~string((string *)&tables);
  std::__cxx11::string::~string((string *)&par);
  std::__cxx11::string::string((string *)&tables,"i",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&argTest,"debug_input",(allocator *)&local_410);
  std::__cxx11::string::string
            ((string *)&argAst,"Print input that was given",(allocator *)&local_3f0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)&par,(string *)&tables,(string *)&argTest,(string *)&argAst,
             (CmdLineInterface *)&lex,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argAst);
  std::__cxx11::string::~string((string *)&argTest);
  std::__cxx11::string::~string((string *)&tables);
  std::__cxx11::string::string((string *)&argTest,"l",(allocator *)&local_410);
  std::__cxx11::string::string((string *)&argAst,"debug_lexer",(allocator *)&local_3f0);
  std::__cxx11::string::string((string *)&local_430,"Print tokens",&local_437);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)&tables,(string *)&argTest,(string *)&argAst,&local_430,
             (CmdLineInterface *)&lex,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&argAst);
  std::__cxx11::string::~string((string *)&argTest);
  std::__cxx11::string::string((string *)&argAst,"",(allocator *)&local_3f0);
  std::__cxx11::string::string((string *)&local_430,"test",&local_437);
  std::__cxx11::string::string((string *)&local_410,"Run tests",&local_436);
  TCLAP::SwitchArg::SwitchArg
            (&argTest,(string *)&argAst,&local_430,&local_410,(CmdLineInterface *)&lex,false,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&argAst);
  std::__cxx11::string::string((string *)&local_430,"a",&local_437);
  std::__cxx11::string::string((string *)&local_410,"debug_ast",&local_436);
  std::__cxx11::string::string
            ((string *)&local_3f0,"Print graphviz representation of AST",&local_435);
  TCLAP::SwitchArg::SwitchArg
            (&argAst,&local_430,&local_410,&local_3f0,(CmdLineInterface *)&lex,false,(Visitor *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  TCLAP::CmdLine::parse((CmdLine *)&lex,argc,argv);
  local_434 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),argAst.super_Arg._163_1_);
  TCLAP::Arg::~Arg(&argAst.super_Arg);
  TCLAP::Arg::~Arg(&argTest.super_Arg);
  TCLAP::Arg::~Arg((Arg *)&tables);
  TCLAP::Arg::~Arg((Arg *)&par);
  TCLAP::CmdLine::~CmdLine((CmdLine *)&lex);
  if (argTest.super_Arg._163_1_ == '\x01') {
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lex.rules.
    super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Tester::
    specify<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
              ((Tester *)&lex,"assign.ed","decl.ed","funcargsret.ed","funcargsvoid.ed",
               "funcvoidvoid.ed","if.ed","ifelse.ed","nestedif.ed","functions.ed","struct.ed",
               "inferdecl.ed");
    Tester::runAll((Tester *)&lex);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&lex);
  }
  else {
    Lexer::Lexer(&lex);
    std::__cxx11::string::string((string *)&par,"test.ed",(allocator *)&tables);
    Lexer::scan(&lex,(string *)&par,local_315,local_e5);
    std::__cxx11::string::~string((string *)&par);
    par.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    par.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    par.root._M_t.super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>._M_t.
    super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>.
    super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<SequenceNode,_std::default_delete<SequenceNode>,_true,_true>)
         (__uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>)0x0;
    par.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<Token,_std::allocator<Token>_>::vector(&local_3d0,&lex.tokens);
    Parser::parse(&par,&local_3d0);
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_3d0);
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tables.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (**(code **)(*(long *)par.root._M_t.
                          super___uniq_ptr_impl<SequenceNode,_std::default_delete<SequenceNode>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_SequenceNode_*,_std::default_delete<SequenceNode>_>
                          .super__Head_base<0UL,_SequenceNode_*,_false>._M_head_impl + 0x28))();
    if ((char)local_434 != '\0') {
      Parser::print(&par);
    }
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::~vector(&tables);
    Parser::~Parser(&par);
    Lexer::~Lexer(&lex);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    bool input = false;
    bool test = false;
    bool tokens = false;
    bool ast = false;
    try {
        TCLAP::CmdLine cmd("Toy compiler", ' ', "0.1");

        TCLAP::SwitchArg argInput("i","debug_input","Print input that was given", cmd, false);
        TCLAP::SwitchArg argTokens("l","debug_lexer","Print tokens", cmd, false);
        TCLAP::SwitchArg argTest("","test","Run tests", cmd, false);
        TCLAP::SwitchArg argAst("a","debug_ast","Print graphviz representation of AST", cmd, false);

        // Parse the argv array.
        cmd.parse(argc, argv);

        // Get the value parsed by each arg.
        input = argInput.getValue();
        tokens = argTokens.getValue();
        test = argTest.getValue();
        ast = argAst.getValue();
    } catch (TCLAP::ArgException &e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
    }

    // run all tests then quit
    if (test) {
        Tester tester;
        tester.specify("assign.ed",
                       "decl.ed",
                       "funcargsret.ed", "funcargsvoid.ed",
                       "funcvoidvoid.ed", "if.ed",
                       "ifelse.ed", "nestedif.ed",
                       "functions.ed", "struct.ed", "inferdecl.ed"
                       );
        tester.runAll();
        return 0;
    }

    Lexer lex;
    lex.scan("test.ed", input, tokens);

    // syntactic validation
    Parser par;
    try {
        par.parse(lex.tokens);
    }
    catch (const SyntacticException& e) {
        std::cout << e.what();
        return -1;
    }

    // semantic validation
    std::vector<SymbolTable> tables;
    try {
        par.root->check(tables);
    }
    catch (const SemanticException& e) {
        std::cout << e.what();
        return -2;
    }

    if (ast) {
        par.print();
    }
    // std::cout << "table size: " << tables.size() << std::endl;
    // for (auto t : tables) {
    //     for (auto i : t) {
    //         std::cout << "name: " << i.first << std::endl
    //                   << "\tkind: " << i.second.kind << std::endl
    //                   << "\ttype: " << i.second.type << std::endl
    //                   << "\tscope: " << i.second.scope << std::endl;
    //     }
    // }
}